

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkDirectoriesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetLinkDirectoriesCommand::HandleDirectContent
          (cmTargetLinkDirectoriesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  string local_58;
  undefined1 local_38 [8];
  cmListFileBacktrace lfbt;
  bool param_4_local;
  bool prepend_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  cmTargetLinkDirectoriesCommand *this_local;
  
  lfbt.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._6_1_ = param_4;
  lfbt.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = prepend;
  cmMakefile::GetBacktrace((cmMakefile *)local_38);
  (*(this->super_cmTargetPropCommandBase).super_cmCommand._vptr_cmCommand[10])
            (&local_58,this,content);
  cmTarget::InsertLinkDirectory
            (tgt,&local_58,(cmListFileBacktrace *)local_38,
             (bool)(lfbt.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._7_1_ & 1));
  std::__cxx11::string::~string((string *)&local_58);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_38);
  return true;
}

Assistant:

bool cmTargetLinkDirectoriesCommand::HandleDirectContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend, bool)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();

  tgt->InsertLinkDirectory(this->Join(content), lfbt, prepend);

  return true; // Successfully handled.
}